

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

int CMcontrol_list_poll(CMControlList cl)

{
  int iVar1;
  long in_RDI;
  bool bVar2;
  CManager unaff_retaddr;
  int consistency_number;
  func_entry *poll_list;
  long *local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_18 = *(long **)(in_RDI + 0x40);
  while( true ) {
    bVar2 = false;
    if (local_18 != (long *)0x0) {
      bVar2 = *local_18 != 0;
    }
    if (!bVar2) break;
    iVar1 = *(int *)(in_RDI + 0x4c);
    IntCManager_unlock(unaff_retaddr,
                       (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (int)((ulong)in_RDI >> 0x20));
    (*(code *)*local_18)(local_18[1],local_18[2]);
    IntCManager_lock(unaff_retaddr,
                     (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (int)((ulong)in_RDI >> 0x20));
    if (iVar1 != *(int *)(in_RDI + 0x4c)) {
      return 1;
    }
    local_18 = local_18 + 4;
  }
  return 1;
}

Assistant:

static int
CMcontrol_list_poll(CMControlList cl)
{
    func_entry *poll_list = cl->polling_function_list;
    while ((poll_list != NULL) && (poll_list->func != NULL)){
	int consistency_number = cl->cl_consistency_number;

	CManager_unlock(poll_list->cm);
	poll_list->func(poll_list->cm, poll_list->client_data);
	CManager_lock(poll_list->cm);
	/* do function */
	if (consistency_number != cl->cl_consistency_number) {
	    return 1;
	}
	poll_list++;
    }
    return 1;
}